

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Importer.cpp
# Opt level: O1

void __thiscall Assimp::Importer::~Importer(Importer *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ProgressHandler *pPVar2;
  aiScene *this_00;
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_Assimp::SharedPostProcessInfo::Base_*>,_std::_Select1st<std::pair<const_unsigned_int,_Assimp::SharedPostProcessInfo::Base_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Assimp::SharedPostProcessInfo::Base_*>_>_>
  *this_01;
  pointer pcVar3;
  pointer ppBVar4;
  bool bVar5;
  pointer ppBVar6;
  ulong uVar7;
  ImporterPimpl *pIVar8;
  ulong uVar9;
  
  DeleteImporterInstanceList(&this->pimpl->mImporter);
  pIVar8 = this->pimpl;
  ppBVar6 = (pIVar8->mPostProcessingSteps).
            super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((pIVar8->mPostProcessingSteps).
      super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppBVar6) {
    uVar7 = 0;
    uVar9 = 1;
    do {
      if (ppBVar6[uVar7] != (BaseProcess *)0x0) {
        (*ppBVar6[uVar7]->_vptr_BaseProcess[1])();
      }
      pIVar8 = this->pimpl;
      ppBVar6 = (pIVar8->mPostProcessingSteps).
                super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      bVar5 = uVar9 < (ulong)((long)(pIVar8->mPostProcessingSteps).
                                    super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppBVar6 >> 3)
      ;
      uVar7 = uVar9;
      uVar9 = (ulong)((int)uVar9 + 1);
    } while (bVar5);
  }
  if (pIVar8->mIOHandler != (IOSystem *)0x0) {
    (*pIVar8->mIOHandler->_vptr_IOSystem[1])();
  }
  pPVar2 = this->pimpl->mProgressHandler;
  if (pPVar2 != (ProgressHandler *)0x0) {
    (*pPVar2->_vptr_ProgressHandler[1])();
  }
  this_00 = this->pimpl->mScene;
  if (this_00 != (aiScene *)0x0) {
    aiScene::~aiScene(this_00);
    operator_delete(this_00,0x80);
  }
  this_01 = (_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_Assimp::SharedPostProcessInfo::Base_*>,_std::_Select1st<std::pair<const_unsigned_int,_Assimp::SharedPostProcessInfo::Base_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Assimp::SharedPostProcessInfo::Base_*>_>_>
             *)this->pimpl->mPPShared;
  if (this_01 !=
      (_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_Assimp::SharedPostProcessInfo::Base_*>,_std::_Select1st<std::pair<const_unsigned_int,_Assimp::SharedPostProcessInfo::Base_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Assimp::SharedPostProcessInfo::Base_*>_>_>
       *)0x0) {
    SharedPostProcessInfo::Clean((SharedPostProcessInfo *)this_01);
    std::
    _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_Assimp::SharedPostProcessInfo::Base_*>,_std::_Select1st<std::pair<const_unsigned_int,_Assimp::SharedPostProcessInfo::Base_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Assimp::SharedPostProcessInfo::Base_*>_>_>
    ::~_Rb_tree(this_01);
    operator_delete(this_01,0x30);
  }
  pIVar8 = this->pimpl;
  if (pIVar8 != (ImporterPimpl *)0x0) {
    std::
    _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_aiMatrix4x4t<float>_>,_std::_Select1st<std::pair<const_unsigned_int,_aiMatrix4x4t<float>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_aiMatrix4x4t<float>_>_>_>
    ::~_Rb_tree(&(pIVar8->mMatrixProperties)._M_t);
    std::
    _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&(pIVar8->mStringProperties)._M_t);
    std::
    _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_float>,_std::_Select1st<std::pair<const_unsigned_int,_float>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_float>_>_>
    ::~_Rb_tree(&(pIVar8->mFloatProperties)._M_t);
    std::
    _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_int>,_std::_Select1st<std::pair<const_unsigned_int,_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
    ::~_Rb_tree(&(pIVar8->mIntProperties)._M_t);
    pcVar3 = (pIVar8->mErrorString)._M_dataplus._M_p;
    paVar1 = &(pIVar8->mErrorString).field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar3 != paVar1) {
      operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
    }
    ppBVar6 = (pIVar8->mPostProcessingSteps).
              super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (ppBVar6 != (pointer)0x0) {
      operator_delete(ppBVar6,(long)(pIVar8->mPostProcessingSteps).
                                    super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)ppBVar6);
    }
    ppBVar4 = (pIVar8->mImporter).
              super__Vector_base<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (ppBVar4 != (pointer)0x0) {
      operator_delete(ppBVar4,(long)(pIVar8->mImporter).
                                    super__Vector_base<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)ppBVar4);
    }
    operator_delete(pIVar8,0x148);
    return;
  }
  return;
}

Assistant:

Importer::~Importer()
{
    // Delete all import plugins
	DeleteImporterInstanceList(pimpl->mImporter);

    // Delete all post-processing plug-ins
    for( unsigned int a = 0; a < pimpl->mPostProcessingSteps.size(); a++)
        delete pimpl->mPostProcessingSteps[a];

    // Delete the assigned IO and progress handler
    delete pimpl->mIOHandler;
    delete pimpl->mProgressHandler;

    // Kill imported scene. Destructor's should do that recursively
    delete pimpl->mScene;

    // Delete shared post-processing data
    delete pimpl->mPPShared;

    // and finally the pimpl itself
    delete pimpl;
}